

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deMemPool.c
# Opt level: O0

int deMemPool_getNumAllocatedBytes(deMemPool *pool,deBool recurse)

{
  int iVar1;
  deMemPool *local_28;
  deMemPool *child;
  MemPage *memPage;
  int numAllocatedBytes;
  deBool recurse_local;
  deMemPool *pool_local;
  
  memPage._0_4_ = 0;
  for (child = (deMemPool *)pool->currentPage; child != (deMemPool *)0x0; child = child->parent) {
    memPage._0_4_ = *(int *)&child->field_0x4 + (int)memPage;
  }
  if (recurse != 0) {
    for (local_28 = pool->firstChild; local_28 != (deMemPool *)0x0; local_28 = local_28->nextPool) {
      iVar1 = deMemPool_getNumAllocatedBytes(local_28,1);
      memPage._0_4_ = iVar1 + (int)memPage;
    }
  }
  return (int)memPage;
}

Assistant:

int deMemPool_getNumAllocatedBytes (const deMemPool* pool, deBool recurse)
{
	int			numAllocatedBytes = 0;
	MemPage*	memPage;

	for (memPage = pool->currentPage; memPage; memPage = memPage->nextPage)
		numAllocatedBytes += memPage->bytesAllocated;

	if (recurse)
	{
		deMemPool* child;
		for (child = pool->firstChild; child; child = child->nextPool)
			numAllocatedBytes += deMemPool_getNumAllocatedBytes(child, DE_TRUE);
	}

	return numAllocatedBytes;
}